

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O1

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmCustomCommand *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  pointer pbVar9;
  undefined8 uVar10;
  size_type sVar11;
  string *a;
  long lVar12;
  cmTarget *this;
  ulong uVar13;
  char *extraout_RDX;
  ulong uVar14;
  string *__x;
  byte bVar15;
  undefined4 uVar16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  undefined1 auVar17 [16];
  __single_object cc;
  cmCustomCommandLine currentLine;
  string comment_buffer;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string job_server_aware;
  string job_pool;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  undefined8 local_250;
  undefined8 local_248;
  char *local_240;
  undefined8 local_238;
  ulong local_230;
  undefined8 local_228;
  cmExecutionStatus *local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  char *local_1f8;
  uint local_1ec;
  char *local_1e8;
  undefined8 local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1c8;
  cmMakefile *local_1b0;
  undefined8 local_1a8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  char *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  string local_158;
  char *local_138;
  undefined8 local_130;
  char local_128;
  undefined7 uStack_127;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string *local_e0;
  pointer local_d8;
  string local_d0;
  undefined1 local_b0 [56];
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar9 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_b0._16_8_ = local_278._16_8_;
    local_b0._0_8_ = local_278._0_8_;
    if ((undefined1 *)local_278._0_8_ == local_278 + 0x10) {
      return false;
    }
LAB_0041a4ab:
    operator_delete((void *)local_b0._0_8_,
                    (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b0._16_8_)->_M_dataplus)._M_p + 1));
    return false;
  }
  pcVar2 = status->Makefile;
  auVar17 = std::__cxx11::string::find_first_of((char *)pbVar9,0x957f40,0);
  if (auVar17._0_8_ != -1) {
    local_278._0_8_ = (pointer)0x21;
    local_278._8_8_ = "called with invalid target name \"";
    local_278._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pbVar9->_M_dataplus)._M_p;
    local_278._24_8_ = pbVar9->_M_string_length;
    local_250 = 0;
    local_248 = 0x54;
    local_240 = 
    "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files.";
    local_238 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_278;
    cmCatViews((string *)local_b0,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
      return false;
    }
    goto LAB_0041a4ab;
  }
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = &local_128;
  local_130 = 0;
  local_128 = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_178 = local_170._M_local_buf + 8;
  local_170._M_allocated_capacity = 0;
  local_170._M_local_buf[8] = '\0';
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 1;
  local_1ec = (uint)CONCAT71(auVar17._9_7_,1);
  local_220 = status;
  local_1b0 = pcVar2;
  local_d8 = pbVar9;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
    iVar7 = std::__cxx11::string::compare((char *)(pbVar3 + 1));
    local_1ec = (uint)(iVar7 != 0);
    uVar8 = 2 - local_1ec;
  }
  uVar14 = (ulong)uVar8;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
  uVar16 = 0;
  bVar6 = uVar14 < uVar13;
  if (uVar14 < uVar13) {
    local_e0 = (string *)&local_220->Error;
    local_1a8 = 0;
    local_1f8 = (char *)0x0;
    local_228 = 0;
    local_230 = 0;
    do {
      uVar8 = uVar8 + 1;
      __x = pbVar9 + uVar14;
      iVar7 = std::__cxx11::string::compare((char *)__x);
      bVar5 = true;
      if (iVar7 == 0) {
LAB_0041a9b3:
        bVar5 = true;
        uVar16 = 1;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)__x);
        if (iVar7 == 0) {
LAB_0041a927:
          bVar5 = true;
          uVar16 = 2;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)__x);
          if (iVar7 == 0) {
            uVar16 = 3;
          }
          else {
            uVar10 = std::__cxx11::string::compare((char *)__x);
            if ((int)uVar10 == 0) {
              local_1a8 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            else {
              uVar10 = std::__cxx11::string::compare((char *)__x);
              if ((int)uVar10 != 0) {
                uVar10 = std::__cxx11::string::compare((char *)__x);
                bVar5 = true;
                if ((int)uVar10 == 0) {
                  local_228 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
                  uVar16 = 8;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)__x);
                  if (iVar7 == 0) {
LAB_0041a7f8:
                    uVar16 = 4;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)__x);
                    if (iVar7 == 0) {
                      uVar16 = 6;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)__x);
                      if (iVar7 == 0) {
                        uVar16 = 7;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare((char *)__x);
                        if (iVar7 == 0) {
                          uVar16 = 0;
                          if (local_218.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                              local_218.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                            push_back(&local_1c8,(value_type *)&local_218);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::_M_erase_at_end(&local_218,
                                              local_218.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare((char *)__x);
                          if (iVar7 == 0) {
                            uVar16 = 5;
                          }
                          else {
                            switch(uVar16) {
                            case 0:
                              uVar16 = 0;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&local_218,__x);
                              break;
                            case 1:
                              local_278._0_8_ = local_278 + 0x10;
                              pcVar4 = (__x->_M_dataplus)._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_278,pcVar4,pcVar4 + __x->_M_string_length);
                              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_278);
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<std::__cxx11::string>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)&local_f8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_278);
                              if ((cmCustomCommand *)local_278._0_8_ !=
                                  (cmCustomCommand *)(local_278 + 0x10)) {
                                operator_delete((void *)local_278._0_8_,
                                                (ulong)(local_278._16_8_ + 1));
                              }
                              goto LAB_0041a9b3;
                            case 2:
                              local_278._0_8_ = local_278 + 0x10;
                              local_278._8_8_ = (char *)0x0;
                              local_278._16_8_ = local_278._16_8_ & 0xffffffffffffff00;
                              bVar5 = cmsys::SystemTools::FileIsFullPath(__x);
                              if ((!bVar5) &&
                                 (sVar11 = cmGeneratorExpression::Find(__x), sVar11 != 0)) {
                                a = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_1b0);
                                local_d0._M_dataplus._M_p._0_1_ = 0x2f;
                                cmStrCat<std::__cxx11::string_const&,char>
                                          ((string *)local_b0,a,(char *)&local_d0);
                                std::__cxx11::string::operator=
                                          ((string *)local_278,(string *)local_b0);
                                if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
                                  operator_delete((void *)local_b0._0_8_,
                                                  (ulong)(local_b0._16_8_ + 1));
                                }
                              }
                              std::__cxx11::string::_M_append
                                        (local_278,(ulong)(__x->_M_dataplus)._M_p);
                              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_278);
                              bVar5 = cmsys::SystemTools::FileIsFullPath((string *)local_278);
                              if (bVar5) {
                                cmsys::SystemTools::CollapseFullPath
                                          ((string *)local_b0,(string *)local_278);
                                std::__cxx11::string::operator=
                                          ((string *)local_278,(string *)local_b0);
                                if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
                                  operator_delete((void *)local_b0._0_8_,
                                                  (ulong)(local_b0._16_8_ + 1));
                                }
                              }
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&local_198,(value_type *)local_278);
                              if ((cmCustomCommand *)local_278._0_8_ !=
                                  (cmCustomCommand *)(local_278 + 0x10)) {
                                operator_delete((void *)local_278._0_8_,
                                                (ulong)(local_278._16_8_ + 1));
                              }
                              goto LAB_0041a927;
                            case 3:
                              std::__cxx11::string::_M_assign((string *)&local_138);
                              uVar16 = 3;
                              break;
                            case 4:
                              std::__cxx11::string::_M_assign((string *)&local_1e8);
                              local_1f8 = local_1e8;
                              goto LAB_0041a7f8;
                            case 5:
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&local_118,__x);
                              uVar16 = 5;
                              break;
                            case 6:
                              std::__cxx11::string::_M_assign((string *)&local_158);
                              uVar16 = 6;
                              break;
                            case 7:
                              std::__cxx11::string::_M_assign((string *)&local_178);
                              uVar16 = 7;
                              break;
                            default:
                              local_278._0_8_ = local_278 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_278,
                                         "Wrong syntax. Unknown type of argument.","");
                              std::__cxx11::string::_M_assign(local_e0);
                              if ((cmCustomCommand *)local_278._0_8_ !=
                                  (cmCustomCommand *)(local_278 + 0x10)) {
                                operator_delete((void *)local_278._0_8_,
                                                (ulong)(local_278._16_8_ + 1));
                              }
                              bVar5 = false;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0041a9b9;
              }
              local_230 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            uVar16 = 8;
            bVar5 = true;
          }
        }
      }
LAB_0041a9b9:
      if (!bVar5) break;
      uVar14 = (ulong)uVar8;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
      bVar6 = uVar14 < uVar13;
    } while (uVar14 < uVar13);
    bVar15 = (byte)local_1a8 ^ 1;
  }
  else {
    local_230 = 0;
    local_228 = 0;
    local_1f8 = (char *)0x0;
    bVar15 = 1;
  }
  pbVar9 = local_d8;
  if (!bVar6) {
    lVar12 = std::__cxx11::string::find_first_of((char *)local_d8,0x93908f,0);
    if (lVar12 == -1) {
      bVar6 = cmGeneratorExpression::IsValidTargetName(pbVar9);
      pcVar2 = local_1b0;
      if (bVar6) {
        bVar6 = cmGlobalGenerator::IsReservedTarget(pbVar9);
        bVar6 = !bVar6;
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        lVar12 = std::__cxx11::string::find((char)pbVar9,0x3a);
        bVar6 = lVar12 == -1;
      }
      if ((bVar6) || (bVar6 = cmMakefile::CheckCMP0037(pcVar2,pbVar9,UTILITY), bVar6)) {
        if (local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&local_1c8,(value_type *)&local_218);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(&local_218,
                            local_218.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        }
        pcVar1 = (cmCustomCommand *)(local_278 + 0x10);
        local_278._8_8_ = (char *)0x0;
        local_278._16_8_ = local_278._16_8_ & 0xffffffffffffff00;
        local_278._0_8_ = pcVar1;
        bVar6 = cmMakefile::EnforceUniqueName(pcVar2,pbVar9,(string *)local_278,true);
        if (bVar6) {
          if ((cmCustomCommand *)local_278._0_8_ != pcVar1) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
LAB_0041ad52:
          if (local_1c8.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_1c8.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            if (local_198.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_198.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if (local_1c8.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_1c8.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_finish) goto LAB_0041ad67;
              if ((local_230 & 1) == 0) {
                if ((local_1c8.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_start ==
                     local_1c8.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_finish & (byte)local_228) != 1)
                goto LAB_0041ad67;
                local_278._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,
                           "COMMAND_EXPAND_LISTS may not be specified without any COMMAND","");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_278);
              }
              else {
                local_278._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,
                           "USES_TERMINAL may not be specified without any COMMAND","");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_278);
              }
            }
            else {
              local_278._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_278,"BYPRODUCTS may not be specified without any COMMAND",
                         "");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_278);
            }
            if ((cmCustomCommand *)local_278._0_8_ != pcVar1) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            bVar6 = true;
            goto LAB_0041ab88;
          }
LAB_0041ad67:
          if ((local_158._M_string_length != 0 & (byte)local_230) != 1) {
            std::make_unique<cmCustomCommand>();
            cmCustomCommand::SetWorkingDirectory((cmCustomCommand *)local_278._0_8_,local_138);
            uVar10 = local_278._0_8_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_48,&local_198);
            cmCustomCommand::SetByproducts((cmCustomCommand *)uVar10,&local_48);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            uVar10 = local_278._0_8_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_60,&local_f8);
            cmCustomCommand::SetDepends((cmCustomCommand *)uVar10,&local_60);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_60);
            uVar10 = local_278._0_8_;
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                      (&local_78,&local_1c8);
            cmCustomCommand::SetCommandLines
                      ((cmCustomCommand *)uVar10,(cmCustomCommandLines *)&local_78);
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                      (&local_78);
            cmCustomCommand::SetEscapeOldStyle
                      ((cmCustomCommand *)local_278._0_8_,(bool)(bVar15 & 1));
            cmCustomCommand::SetComment((cmCustomCommand *)local_278._0_8_,local_1f8);
            cmCustomCommand::SetUsesTerminal
                      ((cmCustomCommand *)local_278._0_8_,(bool)((byte)local_230 & 1));
            cmCustomCommand::SetCommandExpandLists
                      ((cmCustomCommand *)local_278._0_8_,(bool)((byte)local_228 & 1));
            cmCustomCommand::SetJobPool((cmCustomCommand *)local_278._0_8_,&local_158);
            uVar10 = local_278._0_8_;
            value._M_str = extraout_RDX;
            value._M_len = (size_t)local_178;
            bVar6 = cmValue::IsOn((cmValue *)local_170._M_allocated_capacity,value);
            cmCustomCommand::SetJobserverAware((cmCustomCommand *)uVar10,bVar6);
            local_1a0._M_t.
            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
            super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                 )(__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                   )local_278._0_8_;
            local_278._0_8_ = (cmCustomCommand *)0x0;
            this = cmMakefile::AddUtilityCommand(pcVar2,pbVar9,local_1ec._0_1_,&local_1a0);
            std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                      (&local_1a0);
            cmTarget::AddSources(this,&local_118);
            std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                      ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                       local_278);
            bVar6 = true;
            goto LAB_0041ab88;
          }
          local_278._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"JOB_POOL is shadowed by USES_TERMINAL.","");
          std::__cxx11::string::_M_assign((string *)&local_220->Error);
          if ((cmCustomCommand *)local_278._0_8_ != pcVar1) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_220->Error);
          if ((cmCustomCommand *)local_278._0_8_ != pcVar1) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
          if (bVar6) goto LAB_0041ad52;
        }
        bVar6 = false;
        goto LAB_0041ab88;
      }
    }
    else {
      local_278._0_8_ = (cmCustomCommand *)0x26;
      local_278._8_8_ = "called with target name containing a \"";
      local_278._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_b0[0x18] = (pbVar9->_M_dataplus)._M_p[lVar12];
      local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_b0 + 0x18);
      local_b0._0_8_ = (pointer)0x0;
      local_b0._8_8_ = 1;
      local_278._24_8_ = &DAT_00000001;
      local_250 = 0;
      local_248 = 0x22;
      local_240 = "\".  This character is not allowed.";
      local_238 = 0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_278;
      local_b0._16_8_ = local_258;
      cmCatViews(&local_d0,views_00);
      std::__cxx11::string::_M_assign((string *)&local_220->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_) !=
          &local_d0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_),
                        local_d0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar6 = false;
LAB_0041ab88:
  if (local_178 != local_170._M_local_buf + 8) {
    operator_delete(local_178,CONCAT71(local_170._9_7_,local_170._M_local_buf[8]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._1_7_,local_158.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  return bVar6;
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;
  std::string job_server_aware;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_job_server_aware,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "JOB_SERVER_AWARE") {
      doing = doing_job_server_aware;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        case doing_job_server_aware:
          job_server_aware = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cc->SetJobserverAware(cmIsOn(job_server_aware));
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}